

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

QString * unescapeHtml(QString *__return_storage_ptr__,QString *escaped)

{
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&escaped->d);
  QString::replace((QLatin1String *)__return_storage_ptr__,(QLatin1String *)0x4,0x11578d);
  QString::replace((QLatin1String *)__return_storage_ptr__,(QLatin1String *)0x4,0x115792);
  QString::replace((QLatin1String *)__return_storage_ptr__,(QLatin1String *)0x6,0x1152fd);
  QString::replace((QLatin1String *)__return_storage_ptr__,(QLatin1String *)0x5,0x115787);
  return __return_storage_ptr__;
}

Assistant:

QString unescapeHtml(const QString& escaped)
{
	QString unescaped(escaped);
	unescaped.replace(QLatin1String("&lt;"), QLatin1String("<"));
	unescaped.replace(QLatin1String("&gt;"), QLatin1String(">"));
	unescaped.replace(QLatin1String("&quot;"), QLatin1String("\""));
	unescaped.replace(QLatin1String("&amp;"), QLatin1String("&"));
	return unescaped;
}